

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O2

void uv__stream_close(uv_stream_t *handle)

{
  uint *puVar1;
  void *pvVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  
  uv__io_close(handle->loop,&handle->io_watcher);
  uv_read_stop(handle);
  uVar5 = handle->flags;
  if (((uVar5 & 4) != 0) &&
     (uVar4 = uVar5 & 0xfffffffb, uVar3 = uVar5 & 8, uVar5 = uVar4, uVar3 != 0)) {
    puVar1 = &handle->loop->active_handles;
    *puVar1 = *puVar1 - 1;
  }
  handle->flags = uVar5 & 0xffff3fff;
  iVar6 = (handle->io_watcher).fd;
  if (iVar6 != -1) {
    if (2 < iVar6) {
      uv__close(iVar6);
    }
    (handle->io_watcher).fd = -1;
  }
  if (handle->accepted_fd != -1) {
    uv__close(handle->accepted_fd);
    handle->accepted_fd = -1;
  }
  pvVar2 = handle->queued_fds;
  if (pvVar2 != (void *)0x0) {
    for (uVar7 = 0; uVar7 < *(uint *)((long)pvVar2 + 4); uVar7 = uVar7 + 1) {
      uv__close(*(int *)((long)pvVar2 + uVar7 * 4 + 8));
    }
    uv__free(handle->queued_fds);
    handle->queued_fds = (void *)0x0;
  }
  iVar6 = uv__io_active(&handle->io_watcher,5);
  if (iVar6 != 0) {
    __assert_fail("!uv__io_active(&handle->io_watcher, POLLIN | POLLOUT)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/src/unix/stream.c"
                  ,0x694,"void uv__stream_close(uv_stream_t *)");
  }
  return;
}

Assistant:

void uv__stream_close(uv_stream_t* handle) {
  unsigned int i;
  uv__stream_queued_fds_t* queued_fds;

#if defined(__APPLE__)
  /* Terminate select loop first */
  if (handle->select != NULL) {
    uv__stream_select_t* s;

    s = handle->select;

    uv_sem_post(&s->close_sem);
    uv_sem_post(&s->async_sem);
    uv__stream_osx_interrupt_select(handle);
    uv_thread_join(&s->thread);
    uv_sem_destroy(&s->close_sem);
    uv_sem_destroy(&s->async_sem);
    uv__close(s->fake_fd);
    uv__close(s->int_fd);
    uv_close((uv_handle_t*) &s->async, uv__stream_osx_cb_close);

    handle->select = NULL;
  }
#endif /* defined(__APPLE__) */

  uv__io_close(handle->loop, &handle->io_watcher);
  uv_read_stop(handle);
  uv__handle_stop(handle);
  handle->flags &= ~(UV_HANDLE_READABLE | UV_HANDLE_WRITABLE);

  if (handle->io_watcher.fd != -1) {
    /* Don't close stdio file descriptors.  Nothing good comes from it. */
    if (handle->io_watcher.fd > STDERR_FILENO)
      uv__close(handle->io_watcher.fd);
    handle->io_watcher.fd = -1;
  }

  if (handle->accepted_fd != -1) {
    uv__close(handle->accepted_fd);
    handle->accepted_fd = -1;
  }

  /* Close all queued fds */
  if (handle->queued_fds != NULL) {
    queued_fds = handle->queued_fds;
    for (i = 0; i < queued_fds->offset; i++)
      uv__close(queued_fds->fds[i]);
    uv__free(handle->queued_fds);
    handle->queued_fds = NULL;
  }

  assert(!uv__io_active(&handle->io_watcher, POLLIN | POLLOUT));
}